

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

uint get_bits_MSB(cram_block *block,int nbits)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  
  iVar3 = block->bit;
  if (iVar3 + 1 < nbits) {
    uVar2 = 0;
    switch(nbits) {
    case 8:
      bVar1 = block->data[block->byte];
      block->byte = (ulong)(iVar3 < 1) + block->byte;
      block->bit = iVar3 - 1U & 7;
      uVar2 = (uint)(bVar1 >> ((byte)iVar3 & 0x1f)) * 2 & 2;
    case 7:
      bVar1 = block->data[block->byte];
      uVar5 = block->bit;
      block->byte = (ulong)((int)uVar5 < 1) + block->byte;
      block->bit = uVar5 - 1 & 7;
      uVar2 = ((bVar1 >> (uVar5 & 0x1f) & 1) != 0 | uVar2) * 2;
    case 6:
      bVar1 = block->data[block->byte];
      uVar5 = block->bit;
      block->byte = (ulong)((int)uVar5 < 1) + block->byte;
      block->bit = uVar5 - 1 & 7;
      uVar2 = ((bVar1 >> (uVar5 & 0x1f) & 1) != 0 | uVar2) * 2;
    case 5:
      bVar1 = block->data[block->byte];
      uVar5 = block->bit;
      block->byte = (ulong)((int)uVar5 < 1) + block->byte;
      block->bit = uVar5 - 1 & 7;
      uVar2 = ((bVar1 >> (uVar5 & 0x1f) & 1) != 0 | uVar2) * 2;
    case 4:
      bVar1 = block->data[block->byte];
      uVar5 = block->bit;
      block->byte = (ulong)((int)uVar5 < 1) + block->byte;
      block->bit = uVar5 - 1 & 7;
      uVar2 = ((bVar1 >> (uVar5 & 0x1f) & 1) != 0 | uVar2) * 2;
    case 3:
      bVar1 = block->data[block->byte];
      uVar5 = block->bit;
      block->byte = (ulong)((int)uVar5 < 1) + block->byte;
      block->bit = uVar5 - 1 & 7;
      uVar2 = ((bVar1 >> (uVar5 & 0x1f) & 1) != 0 | uVar2) * 2;
    case 2:
      bVar1 = block->data[block->byte];
      uVar5 = block->bit;
      block->byte = (ulong)((int)uVar5 < 1) + block->byte;
      block->bit = uVar5 - 1 & 7;
      uVar2 = ((bVar1 >> (uVar5 & 0x1f) & 1) != 0 | uVar2) * 2;
    case 1:
      uVar5 = block->bit;
      uVar2 = (block->data[block->byte] >> (uVar5 & 0x1f) & 1) != 0 | uVar2;
      block->byte = (ulong)((int)uVar5 < 1) + block->byte;
      block->bit = uVar5 - 1 & 7;
      break;
    default:
      if (nbits < 1) {
        return 0;
      }
      sVar4 = block->byte;
      uVar5 = block->bit;
      uVar2 = 0;
      do {
        uVar2 = (uint)((block->data[sVar4] >> (uVar5 & 0x1f) & 1) != 0) + uVar2 * 2;
        sVar4 = sVar4 + ((int)uVar5 < 1);
        block->byte = sVar4;
        uVar5 = uVar5 - 1 & 7;
        block->bit = uVar5;
        nbits = nbits + -1;
      } while (nbits != 0);
    }
  }
  else {
    iVar3 = iVar3 - nbits;
    uVar2 = ~(-1 << ((byte)nbits & 0x1f)) &
            (uint)(block->data[block->byte] >> ((char)iVar3 + 1U & 0x1f));
    block->bit = iVar3;
    if (iVar3 == -1) {
      block->bit = 7;
      block->byte = block->byte + 1;
      return uVar2;
    }
  }
  return uVar2;
}

Assistant:

static inline unsigned int get_bits_MSB(cram_block *block, int nbits) {
    unsigned int val = 0;
    int i;

#if 0
    // Fits within the current byte */
    if (nbits <= block->bit+1) {
	val = (block->data[block->byte]>>(block->bit-(nbits-1))) & ((1<<nbits)-1);
	if ((block->bit -= nbits) == -1) {
	    block->bit = 7;
	    block->byte++;
	}
	return val;
    }

    // partial first byte
    val = block->data[block->byte] & ((1<<(block->bit+1))-1);
    nbits -= block->bit+1;
    block->bit = 7;
    block->byte++;

    // whole middle bytes
    while (nbits >= 8) {
	val = (val << 8) | block->data[block->byte++];
	nbits -= 8;
    }

    val <<= nbits;
    val |= (block->data[block->byte]>>(block->bit-(nbits-1))) & ((1<<nbits)-1);
    block->bit -= nbits;
    return val;
#endif

#if 0
    /* Inefficient implementation! */
    //printf("{");
    for (i = 0; i < nbits; i++)
	//val = (val << 1) | get_bit_MSB(block);
	GET_BIT_MSB(block, val);
#endif

#if 1
    /* Combination of 1st two methods */
    if (nbits <= block->bit+1) {
	val = (block->data[block->byte]>>(block->bit-(nbits-1))) & ((1<<nbits)-1);
	if ((block->bit -= nbits) == -1) {
	    block->bit = 7;
	    block->byte++;
	}
	return val;
    }

    switch(nbits) {
//    case 15: GET_BIT_MSB(block, val);
//    case 14: GET_BIT_MSB(block, val);
//    case 13: GET_BIT_MSB(block, val);
//    case 12: GET_BIT_MSB(block, val);
//    case 11: GET_BIT_MSB(block, val);
//    case 10: GET_BIT_MSB(block, val);
//    case  9: GET_BIT_MSB(block, val);
    case  8: GET_BIT_MSB(block, val);
    case  7: GET_BIT_MSB(block, val);
    case  6: GET_BIT_MSB(block, val);
    case  5: GET_BIT_MSB(block, val);
    case  4: GET_BIT_MSB(block, val);
    case  3: GET_BIT_MSB(block, val);
    case  2: GET_BIT_MSB(block, val);
    case  1: GET_BIT_MSB(block, val);
	break;

    default:
	for (i = 0; i < nbits; i++)
	    //val = (val << 1) | get_bit_MSB(block);
	    GET_BIT_MSB(block, val);
    }
#endif

    //printf("=0x%x}", val);

    return val;
}